

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O2

ostream * merlin::operator<<(ostream *os,variable_set *v)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  
  std::operator<<(os,"[");
  if ((v->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (v->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    for (uVar2 = 1;
        uVar2 < (ulong)((long)(v->m_v).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(v->m_v).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
      poVar1 = std::operator<<(os,",");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    }
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream &os, variable_set const& v) {
		os << "[";
		if (v.nvar() != 0) {
			os << v.m_v[0];
			for (size_t i = 1; i < v.nvar(); i++)
				os << "," << v.m_v[i];
		}
		os << "]";
		return os;
	}